

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void __thiscall
matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
          (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *this,
          Id<std::shared_ptr<const_mathiu::impl::Expr>_> *id)

{
  undefined1 local_40 [8];
  _Variant_storage<false,_std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  local_38;
  __index_type local_20;
  
  local_40 = (undefined1  [8])((ulong)local_40 & 0xffffffff00000000);
  local_38._M_u._M_rest._M_rest =
       (_Variadic_union<std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
        )0x0;
  local_38._M_u._8_8_ = 0;
  local_38._M_index = '\0';
  local_38._17_7_ = 0;
  std::
  variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>
  ::
  variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,void,void,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,void>
            ((variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>
              *)this,(IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_> *)local_40);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  ::~_Variant_storage(&local_38);
  local_40 = (undefined1  [8])block(id);
  local_20 = '\x01';
  std::__detail::__variant::
  _Move_assign_base<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::operator=((_Move_assign_base<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               *)this,(_Move_assign_base<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_40);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_40);
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }